

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_timer.cpp
# Opt level: O3

void __thiscall lzham::lzham_timer::lzham_timer(lzham_timer *this,timer_ticks start_ticks)

{
  if ((g_inv_freq == 0.0) && (!NAN(g_inv_freq))) {
    g_freq = 1000000;
    g_inv_freq = 9.999999974752427e-07;
    g_init_ticks = clock();
  }
  this->m_start_time = start_ticks;
  this->field_0x10 = (this->field_0x10 & 0xfc) + 1;
  return;
}

Assistant:

lzham_timer::lzham_timer(timer_ticks start_ticks)
   {
      if (!g_inv_freq) 
         init();
      
      m_start_time = start_ticks;
      
      m_started = true;
      m_stopped = false;
   }